

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> * __thiscall
pstore::dump::object::writer<std::ostream,pstore::dump::object_char_traits>
          (object *this,basic_ostream<char,_std::char_traits<char>_> *os,indent *ind,
          object_char_traits *traits)

{
  int iVar1;
  size_type sVar2;
  bool bVar3;
  bool is_compact;
  object_char_traits *traits_local;
  indent *ind_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  object *this_local;
  
  if (writer<std::ostream,pstore::dump::object_char_traits>(std::ostream&,pstore::dump::indent_const&,pstore::dump::object_char_traits_const&)
      ::strings == '\0') {
    iVar1 = __cxa_guard_acquire(&writer<std::ostream,pstore::dump::object_char_traits>(std::ostream&,pstore::dump::indent_const&,pstore::dump::object_char_traits_const&)
                                 ::strings);
    if (iVar1 != 0) {
      object_strings<pstore::dump::object_char_traits>::object_strings
                (&writer<std::basic_ostream<char,_std::char_traits<char>_>,_pstore::dump::object_char_traits>
                  ::strings,traits);
      __cxa_atexit(object_strings<pstore::dump::object_char_traits>::~object_strings,
                   &writer<std::basic_ostream<char,_std::char_traits<char>_>,_pstore::dump::object_char_traits>
                    ::strings,&__dso_handle);
      __cxa_guard_release(&writer<std::ostream,pstore::dump::object_char_traits>(std::ostream&,pstore::dump::indent_const&,pstore::dump::object_char_traits_const&)
                           ::strings);
    }
  }
  bVar3 = true;
  if ((this->compact_ & 1U) == 0) {
    sVar2 = std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
            ::size(&this->members_);
    bVar3 = sVar2 == 0;
  }
  if (bVar3) {
    this_local = (object *)
                 write_compact<std::ostream,pstore::dump::object_char_traits>
                           (this,os,&writer<std::basic_ostream<char,_std::char_traits<char>_>,_pstore::dump::object_char_traits>
                                     ::strings);
  }
  else {
    this_local = (object *)
                 write_full_size<std::ostream,pstore::dump::object_char_traits>
                           (this,os,ind,
                            &writer<std::basic_ostream<char,_std::char_traits<char>_>,_pstore::dump::object_char_traits>
                             ::strings);
  }
  return (basic_ostream<char,_std::char_traits<char>_> *)this_local;
}

Assistant:

OStream & object::writer (OStream & os, indent const & ind,
                                  ObjectCharacterTraits const & traits) const {
            static_assert (
                std::is_same<typename OStream::char_type,
                             typename ObjectCharacterTraits::char_type>::value,
                "Object character traits char_type does not match stream character type");
            static object_strings<ObjectCharacterTraits> const strings{traits};

            bool const is_compact = compact_ || members_.size () == 0;
            if (is_compact) {
                return this->write_compact (os, strings);
            }
            return this->write_full_size (os, ind, strings);
        }